

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

FrameDisplay * Js::JavascriptOperators::OP_LdHandlerScope(Var argThis,ScriptContext *scriptContext)

{
  GlobalObject *pGVar1;
  Recycler *pRVar2;
  FrameDisplay *this;
  TrackAllocData local_60;
  FrameDisplay *local_38;
  FrameDisplay *pDisplay;
  RecyclableObject *pRStack_28;
  uint16 length;
  RecyclableObject *hostObject;
  ScriptContext *scriptContext_local;
  Var argThis_local;
  
  if (argThis != (Var)0x0) {
    hostObject = (RecyclableObject *)scriptContext;
    scriptContext_local = (ScriptContext *)argThis;
    pGVar1 = ScriptContextBase::GetGlobalObject(&scriptContext->super_ScriptContextBase);
    pRStack_28 = (RecyclableObject *)RootObjectBase::GetHostObject(&pGVar1->super_RootObjectBase);
    if (pRStack_28 == (RecyclableObject *)0x0) {
      pGVar1 = ScriptContextBase::GetGlobalObject((ScriptContextBase *)&hostObject->type);
      pRStack_28 = GlobalObject::GetDirectHostObject(pGVar1);
    }
    if (pRStack_28 != (RecyclableObject *)0x0) {
      pDisplay._6_2_ = 7;
      pRVar2 = ScriptContext::GetRecycler((ScriptContext *)hostObject);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&FrameDisplay::typeinfo,(ulong)pDisplay._6_2_ << 3,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                 ,0x1b99);
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_60);
      this = (FrameDisplay *)new<Memory::Recycler>(8,pRVar2,0x446fd0,0);
      FrameDisplay::FrameDisplay(this,pDisplay._6_2_,false);
      local_38 = this;
      BuildHandlerScope(scriptContext_local,pRStack_28,this,(ScriptContext *)hostObject);
      return local_38;
    }
  }
  argThis_local = &NullFrameDisplay;
  return (FrameDisplay *)argThis_local;
}

Assistant:

FrameDisplay * JavascriptOperators::OP_LdHandlerScope(Var argThis, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(ScrObj_LdHandlerScope);
        // The idea here is to build a stack of nested scopes in the form of a JS array.
        //
        // The scope stack for an event handler looks like this:
        //
        // implicit "this"
        // implicit namespace parent scopes

        // Put the implicit "this"
        if (argThis != NULL)
        {
            RecyclableObject* hostObject = scriptContext->GetGlobalObject()->GetHostObject();
            if (hostObject == nullptr)
            {
                hostObject = scriptContext->GetGlobalObject()->GetDirectHostObject();
            }
            if (hostObject != nullptr)
            {
                uint16 length = 7;
                FrameDisplay *pDisplay =
                    RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                BuildHandlerScope(argThis, hostObject, pDisplay, scriptContext);
                return pDisplay;
            }
        }

        return const_cast<FrameDisplay *>(&Js::NullFrameDisplay);
        JIT_HELPER_END(ScrObj_LdHandlerScope);
    }